

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

string * __thiscall
phosg::Image::png_data_url_abi_cxx11_(string *__return_storage_ptr__,Image *this)

{
  string base64_data;
  string png_data;
  string local_50;
  string local_30;
  
  save_abi_cxx11_(&local_30,this,PNG);
  base64_encode(&local_50,&local_30,(char *)0x0);
  ::std::operator+(__return_storage_ptr__,"data:image/png;base64,",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string Image::png_data_url() const {
  string png_data = this->save(Format::PNG);
  string base64_data = base64_encode(png_data);
  return "data:image/png;base64," + base64_data;
}